

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

FILE * testing::internal::OpenFileForWriting(string *output_file)

{
  undefined8 uVar1;
  bool bVar2;
  char *path;
  ostream *poVar3;
  GTestLog local_8c;
  undefined1 local_88 [8];
  FilePath output_dir;
  string local_58;
  undefined1 local_38 [8];
  FilePath output_file_path;
  FILE *fileout;
  string *output_file_local;
  
  output_file_path.pathname_.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)&local_58,output_file);
  FilePath::FilePath((FilePath *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  FilePath::RemoveFileName((FilePath *)local_88,(FilePath *)local_38);
  bVar2 = FilePath::CreateDirectoriesRecursively((FilePath *)local_88);
  if (bVar2) {
    path = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (output_file);
    output_file_path.pathname_.field_2._8_8_ = posix::FOpen(path,"w");
  }
  if (output_file_path.pathname_.field_2._8_8_ == 0) {
    GTestLog::GTestLog(&local_8c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/build_O0/_deps/gtest-src/googletest/src/gtest.cc"
                       ,0xdf);
    poVar3 = GTestLog::GetStream(&local_8c);
    poVar3 = std::operator<<(poVar3,"Unable to open file \"");
    poVar3 = std::operator<<(poVar3,(string *)output_file);
    std::operator<<(poVar3,"\"");
    GTestLog::~GTestLog(&local_8c);
  }
  uVar1 = output_file_path.pathname_.field_2._8_8_;
  FilePath::~FilePath((FilePath *)local_88);
  FilePath::~FilePath((FilePath *)local_38);
  return (FILE *)uVar1;
}

Assistant:

static FILE* OpenFileForWriting(const std::string& output_file) {
  FILE* fileout = nullptr;
  FilePath output_file_path(output_file);
  FilePath output_dir(output_file_path.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    fileout = posix::FOpen(output_file.c_str(), "w");
  }
  if (fileout == nullptr) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file << "\"";
  }
  return fileout;
}